

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void trigger_set(ecs_world_t *world,ecs_entity_t *entities,EcsTrigger *ct,int32_t count)

{
  char *pcVar1;
  char *pcVar2;
  ecs_table_event_t local_68;
  ecs_c_info_t *local_48;
  ecs_c_info_t *c_info;
  ecs_entity_t c;
  EcsTrigger *pEStack_30;
  int i;
  EcsTrigger *el;
  EcsTrigger *pEStack_20;
  int32_t count_local;
  EcsTrigger *ct_local;
  ecs_entity_t *entities_local;
  ecs_world_t *world_local;
  
  pEStack_30 = (EcsTrigger *)0x0;
  c._4_4_ = 0;
  el._4_4_ = count;
  pEStack_20 = ct;
  ct_local = (EcsTrigger *)entities;
  entities_local = (ecs_entity_t *)world;
  while( true ) {
    if (el._4_4_ <= c._4_4_) {
      return;
    }
    c_info = (ecs_c_info_t *)pEStack_20[c._4_4_].component;
    local_48 = ecs_get_or_create_c_info((ecs_world_t *)entities_local,(ecs_entity_t)c_info);
    if (pEStack_20[c._4_4_].kind == 0x109) {
      pEStack_30 = trigger_find_or_create(&local_48->on_add,(&ct_local->kind)[c._4_4_]);
    }
    else {
      if (pEStack_20[c._4_4_].kind != 0x10a) {
        _ecs_abort(2,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                   ,0x279);
        abort();
      }
      pEStack_30 = trigger_find_or_create(&local_48->on_remove,(&ct_local->kind)[c._4_4_]);
    }
    _ecs_assert(pEStack_30 != (EcsTrigger *)0x0,0xc,(char *)0x0,"el != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0x27d);
    if (pEStack_30 == (EcsTrigger *)0x0) break;
    memcpy(pEStack_30,pEStack_20 + c._4_4_,0x28);
    pEStack_30->self = (&ct_local->kind)[c._4_4_];
    local_68.kind = EcsTableComponentInfo;
    local_68.query = (ecs_query_t *)0x0;
    local_68.matched_table_index = 0;
    local_68.component = (ecs_entity_t)c_info;
    ecs_notify_tables((ecs_world_t *)entities_local,&local_68);
    pcVar1 = "EcsOnRemove";
    if (pEStack_20[c._4_4_].kind == 0x109) {
      pcVar1 = "EcsOnAdd";
    }
    pcVar2 = ecs_get_name((ecs_world_t *)entities_local,(ecs_entity_t)c_info);
    _ecs_trace(1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
               ,0x28a,"trigger #[green]%s#[normal] created for component #[red]%s",pcVar1 + 3,pcVar2
              );
    c._4_4_ = c._4_4_ + 1;
  }
  __assert_fail("el != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0x27d,
                "void trigger_set(ecs_world_t *, const ecs_entity_t *, EcsTrigger *, int32_t)");
}

Assistant:

static
void trigger_set(
    ecs_world_t *world,
    const ecs_entity_t *entities,
    EcsTrigger *ct,
    int32_t count)
{
    EcsTrigger *el = NULL;

    int i;
    for (i = 0; i < count; i ++) {
        ecs_entity_t c = ct[i].component;
        ecs_c_info_t *c_info = ecs_get_or_create_c_info(world, c);

        switch(ct[i].kind) {
        case EcsOnAdd:
            el = trigger_find_or_create(&c_info->on_add, entities[i]);
            break;
        case EcsOnRemove:
            el = trigger_find_or_create(&c_info->on_remove, entities[i]);
            break;
        default:
            ecs_abort(ECS_INVALID_PARAMETER, NULL);
            break;
        }
        
        ecs_assert(el != NULL, ECS_INTERNAL_ERROR, NULL);

        *el = ct[i];
        el->self = entities[i];

        ecs_notify_tables(world, &(ecs_table_event_t) {
            .kind = EcsTableComponentInfo,
            .component = c
        });        

        ecs_trace_1("trigger #[green]%s#[normal] created for component #[red]%s",
            ct[i].kind == EcsOnAdd
                ? "OnAdd"
                : "OnRemove", ecs_get_name(world, c));
    }
}